

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalNinjaGenerator::Generate(cmGlobalNinjaGenerator *this)

{
  _func_int **rhss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmake *this_00;
  bool bVar2;
  PolicyStatus PVar3;
  ostream *poVar4;
  ostringstream msg;
  string local_1e0;
  cmListFileBacktrace local_1c0;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [6];
  ios_base local_130 [264];
  
  rhss = (_func_int **)(local_1a0 + 0x10);
  local_190[0]._M_allocated_capacity._0_4_ = 0x332e31;
  local_1a0._8_8_ = 3;
  local_1a0._0_8_ = rhss;
  bVar2 = cmSystemTools::VersionCompare(OP_LESS,(this->NinjaVersion)._M_dataplus._M_p,(char *)rhss);
  if ((_func_int **)local_1a0._0_8_ != rhss) {
    operator_delete((void *)local_1a0._0_8_,
                    CONCAT44(local_190[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_190[0]._M_allocated_capacity) + 1);
  }
  if (!bVar2) {
    OpenBuildFileStream(this);
    OpenRulesFileStream(this);
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
    ::clear(&(this->TargetDependsClosures)._M_t);
    InitOutputPathPrefix(this);
    paVar1 = &local_1e0.field_2;
    local_1e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"all","");
    NinjaOutputPath((string *)local_1a0,this,&local_1e0);
    std::__cxx11::string::operator=((string *)&this->TargetAll,(string *)local_1a0);
    if ((_func_int **)local_1a0._0_8_ != rhss) {
      operator_delete((void *)local_1a0._0_8_,
                      CONCAT44(local_190[0]._M_allocated_capacity._4_4_,
                               (undefined4)local_190[0]._M_allocated_capacity) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e0._M_dataplus._M_p,
                      CONCAT44(local_1e0.field_2._M_allocated_capacity._4_4_,
                               local_1e0.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_1e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"CMakeCache.txt","");
    NinjaOutputPath((string *)local_1a0,this,&local_1e0);
    std::__cxx11::string::operator=((string *)&this->CMakeCacheFile,(string *)local_1a0);
    if ((_func_int **)local_1a0._0_8_ != rhss) {
      operator_delete((void *)local_1a0._0_8_,
                      CONCAT44(local_190[0]._M_allocated_capacity._4_4_,
                               (undefined4)local_190[0]._M_allocated_capacity) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e0._M_dataplus._M_p,
                      CONCAT44(local_1e0.field_2._M_allocated_capacity._4_4_,
                               local_1e0.field_2._M_allocated_capacity._0_4_) + 1);
    }
    PVar3 = cmMakefile::GetPolicyStatus
                      ((*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                         LocalGenerators.
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         ._M_impl.super__Vector_impl_data._M_start)->Makefile,CMP0058);
    this->PolicyCMP0058 = PVar3;
    this->ComputingUnknownDependencies = PVar3 < NEW;
    cmGlobalGenerator::Generate((cmGlobalGenerator *)this);
    WriteAssumedSourceDependencies(this);
    WriteTargetAliases(this,(ostream *)this->BuildFileStream);
    WriteFolderTargets(this,(ostream *)this->BuildFileStream);
    WriteUnknownExplicitDependencies(this,(ostream *)this->BuildFileStream);
    WriteBuiltinTargets(this,(ostream *)this->BuildFileStream);
    if (((cmSystemTools::s_ErrorOccured != false) || (cmSystemTools::s_FatalErrorOccured != false))
       || (bVar2 = cmSystemTools::GetInterruptFlag(), bVar2)) {
      std::ios::clear((int)this->RulesFileStream +
                      (int)(this->RulesFileStream->super_ofstream).
                           super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                           [-3]);
      std::ios::clear((int)this->BuildFileStream +
                      (int)(this->BuildFileStream->super_ofstream).
                           super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                           [-3]);
    }
    CloseCompileCommandsStream(this);
    CloseRulesFileStream(this);
    CloseBuildFileStream(this);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"The detected version of Ninja (",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,(this->NinjaVersion)._M_dataplus._M_p,
             (this->NinjaVersion)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,") is less than the version of Ninja required by CMake (",0x37);
  paVar1 = &local_1e0.field_2;
  local_1e0.field_2._M_allocated_capacity._0_4_ = 0x332e31;
  local_1e0._M_string_length = 3;
  local_1e0._M_dataplus._M_p = (pointer)paVar1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,paVar1->_M_local_buf,3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,").",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,
                    CONCAT44(local_1e0.field_2._M_allocated_capacity._4_4_,
                             local_1e0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  this_00 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
  std::__cxx11::stringbuf::str();
  cmListFileBacktrace::cmListFileBacktrace(&local_1c0);
  cmake::IssueMessage(this_00,FATAL_ERROR,&local_1e0,&local_1c0);
  cmListFileBacktrace::~cmListFileBacktrace(&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,
                    CONCAT44(local_1e0.field_2._M_allocated_capacity._4_4_,
                             local_1e0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::Generate()
{
  // Check minimum Ninja version.
  if (cmSystemTools::VersionCompare(cmSystemTools::OP_LESS,
                                    this->NinjaVersion.c_str(),
                                    RequiredNinjaVersion().c_str())) {
    std::ostringstream msg;
    msg << "The detected version of Ninja (" << this->NinjaVersion;
    msg << ") is less than the version of Ninja required by CMake (";
    msg << this->RequiredNinjaVersion() << ").";
    this->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, msg.str());
    return;
  }
  this->OpenBuildFileStream();
  this->OpenRulesFileStream();

  this->TargetDependsClosures.clear();

  this->InitOutputPathPrefix();
  this->TargetAll = this->NinjaOutputPath("all");
  this->CMakeCacheFile = this->NinjaOutputPath("CMakeCache.txt");

  this->PolicyCMP0058 =
    this->LocalGenerators[0]->GetMakefile()->GetPolicyStatus(
      cmPolicies::CMP0058);
  this->ComputingUnknownDependencies =
    (this->PolicyCMP0058 == cmPolicies::OLD ||
     this->PolicyCMP0058 == cmPolicies::WARN);

  this->cmGlobalGenerator::Generate();

  this->WriteAssumedSourceDependencies();
  this->WriteTargetAliases(*this->BuildFileStream);
  this->WriteFolderTargets(*this->BuildFileStream);
  this->WriteUnknownExplicitDependencies(*this->BuildFileStream);
  this->WriteBuiltinTargets(*this->BuildFileStream);

  if (cmSystemTools::GetErrorOccuredFlag()) {
    this->RulesFileStream->setstate(std::ios::failbit);
    this->BuildFileStream->setstate(std::ios::failbit);
  }

  this->CloseCompileCommandsStream();
  this->CloseRulesFileStream();
  this->CloseBuildFileStream();
}